

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp_x86::forward_inplace(BinaryOp_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  _func_int *p_Var1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  undefined1 (*pauVar13) [16];
  int iVar14;
  float fVar15;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_XMM3 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  __m128 afVar25;
  binary_op_pow op;
  __m128 _b;
  binary_op_pow local_a1;
  Mat *local_a0;
  ulong local_98;
  size_t local_90;
  size_t local_88;
  ulong local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  float local_58 [2];
  float afStack_50 [2];
  float local_48 [2];
  float afStack_40 [4];
  
  p_Var1 = this->_vptr_BinaryOp_x86[-3];
  switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var1)) {
  case 0:
    fVar15 = *(float *)(&this->field_0xd8 + (long)p_Var1);
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar10 = 0;
    uVar9 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar9 = uVar10;
    }
    for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      pvVar2 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      pauVar13 = (undefined1 (*) [16])(sVar4 * uVar10 * sVar3 + (long)pvVar2);
      lVar11 = 0;
      for (iVar14 = 0; iVar14 + 3 < iVar8; iVar14 = iVar14 + 4) {
        auVar16._0_4_ = *(float *)*pauVar13 + fVar15;
        auVar16._4_4_ = *(float *)((long)*pauVar13 + 4) + fVar15;
        auVar16._8_4_ = *(float *)((long)*pauVar13 + 8) + fVar15;
        auVar16._12_4_ = *(float *)((long)*pauVar13 + 0xc) + fVar15;
        *pauVar13 = auVar16;
        pauVar13 = pauVar13 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar12 = sVar4 * sVar3 * uVar10;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        *(float *)((long)pvVar2 + lVar11 * 4 + lVar12) =
             *(float *)((long)pvVar2 + lVar11 * 4 + lVar12) + fVar15;
      }
    }
    break;
  case 1:
    fVar15 = *(float *)(&this->field_0xd8 + (long)p_Var1);
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar10 = 0;
    uVar9 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar9 = uVar10;
    }
    for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      pvVar2 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      pauVar13 = (undefined1 (*) [16])(sVar4 * uVar10 * sVar3 + (long)pvVar2);
      lVar11 = 0;
      for (iVar14 = 0; iVar14 + 3 < iVar8; iVar14 = iVar14 + 4) {
        auVar19._0_4_ = *(float *)*pauVar13 - fVar15;
        auVar19._4_4_ = *(float *)((long)*pauVar13 + 4) - fVar15;
        auVar19._8_4_ = *(float *)((long)*pauVar13 + 8) - fVar15;
        auVar19._12_4_ = *(float *)((long)*pauVar13 + 0xc) - fVar15;
        *pauVar13 = auVar19;
        pauVar13 = pauVar13 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar12 = sVar4 * sVar3 * uVar10;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        *(float *)((long)pvVar2 + lVar11 * 4 + lVar12) =
             *(float *)((long)pvVar2 + lVar11 * 4 + lVar12) - fVar15;
      }
    }
    break;
  case 2:
    fVar15 = *(float *)(&this->field_0xd8 + (long)p_Var1);
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar10 = 0;
    uVar9 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar9 = uVar10;
    }
    for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      pvVar2 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      pauVar13 = (undefined1 (*) [16])(sVar4 * uVar10 * sVar3 + (long)pvVar2);
      lVar11 = 0;
      for (iVar14 = 0; iVar14 + 3 < iVar8; iVar14 = iVar14 + 4) {
        auVar17._0_4_ = *(float *)*pauVar13 * fVar15;
        auVar17._4_4_ = *(float *)((long)*pauVar13 + 4) * fVar15;
        auVar17._8_4_ = *(float *)((long)*pauVar13 + 8) * fVar15;
        auVar17._12_4_ = *(float *)((long)*pauVar13 + 0xc) * fVar15;
        *pauVar13 = auVar17;
        pauVar13 = pauVar13 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar12 = sVar4 * sVar3 * uVar10;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        *(float *)((long)pvVar2 + lVar11 * 4 + lVar12) =
             *(float *)((long)pvVar2 + lVar11 * 4 + lVar12) * fVar15;
      }
    }
    break;
  case 3:
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    fVar15 = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var1);
    uVar10 = 0;
    uVar9 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar9 = uVar10;
    }
    for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      pvVar2 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      pauVar13 = (undefined1 (*) [16])(sVar4 * uVar10 * sVar3 + (long)pvVar2);
      lVar11 = 0;
      for (iVar14 = 0; iVar14 + 3 < iVar8; iVar14 = iVar14 + 4) {
        auVar18._0_4_ = *(float *)*pauVar13 * fVar15;
        auVar18._4_4_ = *(float *)((long)*pauVar13 + 4) * fVar15;
        auVar18._8_4_ = *(float *)((long)*pauVar13 + 8) * fVar15;
        auVar18._12_4_ = *(float *)((long)*pauVar13 + 0xc) * fVar15;
        *pauVar13 = auVar18;
        pauVar13 = pauVar13 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar12 = sVar4 * sVar3 * uVar10;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        *(float *)((long)pvVar2 + lVar11 * 4 + lVar12) =
             *(float *)((long)pvVar2 + lVar11 * 4 + lVar12) * fVar15;
      }
    }
    break;
  case 4:
    fVar15 = *(float *)(&this->field_0xd8 + (long)p_Var1);
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar10 = 0;
    uVar9 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar9 = uVar10;
    }
    for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      pvVar2 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      pauVar13 = (undefined1 (*) [16])(sVar4 * uVar10 * sVar3 + (long)pvVar2);
      lVar11 = 0;
      for (iVar14 = 0; iVar14 + 3 < iVar8; iVar14 = iVar14 + 4) {
        auVar7._4_4_ = fVar15;
        auVar7._0_4_ = fVar15;
        auVar7._8_4_ = fVar15;
        auVar7._12_4_ = fVar15;
        auVar20 = maxps(*pauVar13,auVar7);
        *pauVar13 = auVar20;
        pauVar13 = pauVar13 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar12 = sVar4 * sVar3 * uVar10;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        fVar21 = *(float *)((long)pvVar2 + lVar11 * 4 + lVar12);
        if (fVar21 <= fVar15) {
          fVar21 = fVar15;
        }
        *(float *)((long)pvVar2 + lVar11 * 4 + lVar12) = fVar21;
      }
    }
    break;
  case 5:
    fVar15 = *(float *)(&this->field_0xd8 + (long)p_Var1);
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar10 = 0;
    uVar9 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar9 = uVar10;
    }
    for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      pvVar2 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      pauVar13 = (undefined1 (*) [16])(sVar4 * uVar10 * sVar3 + (long)pvVar2);
      lVar11 = 0;
      for (iVar14 = 0; iVar14 + 3 < iVar8; iVar14 = iVar14 + 4) {
        auVar6._4_4_ = fVar15;
        auVar6._0_4_ = fVar15;
        auVar6._8_4_ = fVar15;
        auVar6._12_4_ = fVar15;
        auVar20 = minps(*pauVar13,auVar6);
        *pauVar13 = auVar20;
        pauVar13 = pauVar13 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar12 = sVar4 * sVar3 * uVar10;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        fVar21 = *(float *)((long)pvVar2 + lVar11 * 4 + lVar12);
        if (fVar15 <= fVar21) {
          fVar21 = fVar15;
        }
        *(float *)((long)pvVar2 + lVar11 * 4 + lVar12) = fVar21;
      }
    }
    break;
  case 6:
    local_78 = *(float *)(&this->field_0xd8 + (long)p_Var1);
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_68 = ZEXT416((uint)local_78);
    local_80 = 0;
    local_98 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_98 = local_80;
    }
    local_a0 = bottom_top_blob;
    fStack_74 = local_78;
    fStack_70 = local_78;
    fStack_6c = local_78;
    while (local_80 != local_98) {
      pvVar2 = bottom_top_blob->data;
      local_90 = bottom_top_blob->elemsize;
      local_88 = bottom_top_blob->cstep;
      pauVar13 = (undefined1 (*) [16])(local_88 * local_80 * local_90 + (long)pvVar2);
      local_48[1] = fStack_74;
      local_48[0] = local_78;
      afStack_40[1] = fStack_6c;
      afStack_40[0] = fStack_70;
      lVar11 = 0;
      for (iVar14 = 0; uVar9 = local_80, bottom_top_blob = local_a0, iVar14 + 3 < iVar8;
          iVar14 = iVar14 + 4) {
        local_58 = *(float (*) [2])*pauVar13;
        afStack_50 = *(float (*) [2])(*pauVar13 + 8);
        afVar25 = BinaryOp_x86_functor::binary_op_pow::func_pack4
                            (&local_a1,(__m128 *)local_58,(__m128 *)local_48);
        auVar5._8_4_ = extraout_XMM0_Dc;
        auVar5._0_8_ = afVar25._0_8_;
        auVar5._12_4_ = extraout_XMM0_Dd;
        *pauVar13 = auVar5;
        pauVar13 = pauVar13 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar12 = local_88 * local_90 * local_80;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        fVar15 = powf(*(float *)((long)pvVar2 + lVar11 * 4 + lVar12),(float)local_68._0_4_);
        *(float *)((long)pvVar2 + lVar11 * 4 + lVar12) = fVar15;
      }
      local_80 = uVar9 + 1;
    }
    break;
  case 7:
    fVar15 = *(float *)(&this->field_0xd8 + (long)p_Var1);
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar10 = 0;
    uVar9 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar9 = uVar10;
    }
    for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      pvVar2 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      pauVar13 = (undefined1 (*) [16])(sVar4 * uVar10 * sVar3 + (long)pvVar2);
      lVar11 = 0;
      for (iVar14 = 0; iVar14 + 3 < iVar8; iVar14 = iVar14 + 4) {
        auVar20._0_4_ = fVar15 - *(float *)*pauVar13;
        auVar20._4_4_ = fVar15 - *(float *)((long)*pauVar13 + 4);
        auVar20._8_4_ = fVar15 - *(float *)((long)*pauVar13 + 8);
        auVar20._12_4_ = fVar15 - *(float *)((long)*pauVar13 + 0xc);
        *pauVar13 = auVar20;
        pauVar13 = pauVar13 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar12 = sVar4 * sVar3 * uVar10;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        *(float *)((long)pvVar2 + lVar11 * 4 + lVar12) =
             fVar15 - *(float *)((long)pvVar2 + lVar11 * 4 + lVar12);
      }
    }
    break;
  case 8:
    fVar15 = *(float *)(&this->field_0xd8 + (long)p_Var1);
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar10 = 0;
    uVar9 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar9 = uVar10;
    }
    for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      pvVar2 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      pauVar13 = (undefined1 (*) [16])(sVar4 * uVar10 * sVar3 + (long)pvVar2);
      lVar11 = 0;
      for (iVar14 = 0; iVar14 + 3 < iVar8; iVar14 = iVar14 + 4) {
        auVar20 = *pauVar13;
        in_XMM3 = rcpps(in_XMM3,auVar20);
        fVar21 = fVar15 * in_XMM3._0_4_;
        fVar22 = fVar15 * in_XMM3._4_4_;
        fVar23 = fVar15 * in_XMM3._8_4_;
        fVar24 = fVar15 * in_XMM3._12_4_;
        *(float *)*pauVar13 = (fVar15 - auVar20._0_4_ * fVar21) * in_XMM3._0_4_ + fVar21;
        *(float *)(*pauVar13 + 4) = (fVar15 - auVar20._4_4_ * fVar22) * in_XMM3._4_4_ + fVar22;
        *(float *)(*pauVar13 + 8) = (fVar15 - auVar20._8_4_ * fVar23) * in_XMM3._8_4_ + fVar23;
        *(float *)(*pauVar13 + 0xc) = (fVar15 - auVar20._12_4_ * fVar24) * in_XMM3._12_4_ + fVar24;
        pauVar13 = pauVar13 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar12 = sVar4 * sVar3 * uVar10;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        *(float *)((long)pvVar2 + lVar11 * 4 + lVar12) =
             fVar15 / *(float *)((long)pvVar2 + lVar11 * 4 + lVar12);
      }
    }
  }
  return 0;
}

Assistant:

int BinaryOp_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace BinaryOp_x86_functor;

    if (op_type == Operation_ADD)
        return binary_op_scalar_inplace<binary_op_add>(bottom_top_blob, b, opt);

    if (op_type == Operation_SUB)
        return binary_op_scalar_inplace<binary_op_sub>(bottom_top_blob, b, opt);

    if (op_type == Operation_MUL)
        return binary_op_scalar_inplace<binary_op_mul>(bottom_top_blob, b, opt);

    if (op_type == Operation_DIV)
        return binary_op_scalar_inplace<binary_op_div>(bottom_top_blob, b, opt);

    if (op_type == Operation_MAX)
        return binary_op_scalar_inplace<binary_op_max>(bottom_top_blob, b, opt);

    if (op_type == Operation_MIN)
        return binary_op_scalar_inplace<binary_op_min>(bottom_top_blob, b, opt);

    if (op_type == Operation_POW)
        return binary_op_scalar_inplace<binary_op_pow>(bottom_top_blob, b, opt);

    if (op_type == Operation_RSUB)
        return binary_op_scalar_inplace<binary_op_rsub>(bottom_top_blob, b, opt);

    if (op_type == Operation_RDIV)
        return binary_op_scalar_inplace<binary_op_rdiv>(bottom_top_blob, b, opt);

    return 0;
}